

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

int eynorr(char *sp)

{
  int iVar1;
  int s;
  char *sp_local;
  
  if (inmacro == 0) {
    ewprintf("%s? (y, n or r) ",sp);
    while (((iVar1 = getkey(0), iVar1 != 0x79 && (iVar1 != 0x59)) && (iVar1 != 0x20))) {
      if (((iVar1 == 0x6e) || (iVar1 == 0x4e)) || (iVar1 == 0xd)) {
        eerase();
        return 0;
      }
      if ((iVar1 == 0x72) || (iVar1 == 0x52)) {
        eerase();
        return 4;
      }
      if (iVar1 == 7) {
        eerase();
        iVar1 = ctrlg(8,1);
        return iVar1;
      }
      ewprintf("Please answer y, n or r.");
    }
    eerase();
  }
  return 1;
}

Assistant:

int
eynorr(const char *sp)
{
	int	 s;

	if (inmacro)
		return (TRUE);

	ewprintf("%s? (y, n or r) ", sp);
	for (;;) {
		s = getkey(FALSE);
		if (s == 'y' || s == 'Y' || s == ' ') {
			eerase();
			return (TRUE);
		}
		if (s == 'n' || s == 'N' || s == CCHR('M')) {
			eerase();
			return (FALSE);
		}
		if (s == 'r' || s == 'R') {
			eerase();
			return (REVERT);
		}
		if (s == CCHR('G')) {
			eerase();
			return (ctrlg(FFRAND, 1));
		}
		ewprintf("Please answer y, n or r.");
	}
	/* NOTREACHED */
}